

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avx512_gemm.h
# Opt level: O0

void intgemm::AVX512BW::Kernels16::Quantize
               (float *input,int16_t *output,float quant_mult,Index size)

{
  __m512 quant_mult_reg_00;
  uint in_EDX;
  undefined2 *in_RSI;
  long in_RDI;
  undefined1 auVar1 [32];
  undefined1 auVar2 [64];
  undefined1 auVar3 [64];
  uint in_XMM0_Da;
  float *end;
  __m512 quant_mult_reg;
  undefined1 local_2c0 [64];
  undefined8 local_280;
  undefined8 uStackY_278;
  undefined8 uStackY_270;
  undefined8 uStackY_268;
  float *pfStackY_260;
  undefined8 uStackY_258;
  undefined8 uStackY_250;
  undefined1 in_stack_fffffffffffffdc0 [56];
  float *pfVar4;
  undefined2 *local_190;
  long local_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  float *pfStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  undefined2 local_5a;
  undefined2 *local_58;
  
  auVar2 = vbroadcastss_avx512f(ZEXT416(in_XMM0_Da));
  local_180 = auVar2._0_8_;
  uStack_178 = auVar2._8_8_;
  uStack_170 = auVar2._16_8_;
  uStack_168 = auVar2._24_8_;
  pfStack_160 = auVar2._32_8_;
  uStack_158 = auVar2._40_8_;
  uStack_150 = auVar2._48_8_;
  uStack_148 = auVar2._56_8_;
  pfStackY_260 = pfStack_160;
  local_190 = in_RSI;
  for (local_188 = in_RDI; local_188 != in_RDI + (ulong)in_EDX * 4; local_188 = local_188 + 0x40) {
    local_280 = local_180;
    uStackY_278 = uStack_178;
    uStackY_270 = uStack_170;
    uStackY_268 = uStack_168;
    uStackY_258 = uStack_158;
    uStackY_250 = uStack_150;
    auVar3._32_8_ = pfStackY_260;
    auVar3._0_32_ = auVar2._0_32_;
    auVar3._40_8_ = uStack_158;
    auVar3._48_8_ = uStack_150;
    auVar3._56_8_ = uStack_148;
    auVar3 = vmovdqa64_avx512f(auVar3);
    vmovdqa64_avx512f(auVar3);
    quant_mult_reg_00[2] = (float)in_stack_fffffffffffffdc0._0_4_;
    quant_mult_reg_00[3] = (float)in_stack_fffffffffffffdc0._4_4_;
    quant_mult_reg_00[4] = (float)in_stack_fffffffffffffdc0._8_4_;
    quant_mult_reg_00[5] = (float)in_stack_fffffffffffffdc0._12_4_;
    quant_mult_reg_00[6] = (float)in_stack_fffffffffffffdc0._16_4_;
    quant_mult_reg_00[7] = (float)in_stack_fffffffffffffdc0._20_4_;
    quant_mult_reg_00[8] = (float)in_stack_fffffffffffffdc0._24_4_;
    quant_mult_reg_00[9] = (float)in_stack_fffffffffffffdc0._28_4_;
    quant_mult_reg_00[10] = (float)in_stack_fffffffffffffdc0._32_4_;
    quant_mult_reg_00[0xb] = (float)in_stack_fffffffffffffdc0._36_4_;
    quant_mult_reg_00[0xc] = (float)in_stack_fffffffffffffdc0._40_4_;
    quant_mult_reg_00[0xd] = (float)in_stack_fffffffffffffdc0._44_4_;
    quant_mult_reg_00[0xe] = (float)in_stack_fffffffffffffdc0._48_4_;
    quant_mult_reg_00[0xf] = (float)in_stack_fffffffffffffdc0._52_4_;
    quant_mult_reg_00[0] = (float)(undefined4)uStack_148;
    quant_mult_reg_00[1] = (float)uStack_148._4_4_;
    pfVar4 = pfStackY_260;
    QuantizerGrab(pfStackY_260,quant_mult_reg_00);
    local_2c0 = vmovdqa64_avx512f(auVar3);
    memcpy(local_100,local_2c0,0x40);
    local_58 = local_190;
    auVar3 = vmovdqa64_avx512f(local_100);
    local_5a = 0xffff;
    local_c0 = vmovdqa64_avx512f(auVar3);
    auVar3 = vmovdqa64_avx512f(local_c0);
    auVar1 = vpmovsdw_avx512f(auVar3);
    *local_190 = auVar1._0_2_;
    local_190[1] = auVar1._2_2_;
    local_190[2] = auVar1._4_2_;
    local_190[3] = auVar1._6_2_;
    local_190[4] = auVar1._8_2_;
    local_190[5] = auVar1._10_2_;
    local_190[6] = auVar1._12_2_;
    local_190[7] = auVar1._14_2_;
    local_190[8] = auVar1._16_2_;
    local_190[9] = auVar1._18_2_;
    local_190[10] = auVar1._20_2_;
    local_190[0xb] = auVar1._22_2_;
    local_190[0xc] = auVar1._24_2_;
    local_190[0xd] = auVar1._26_2_;
    local_190[0xe] = auVar1._28_2_;
    local_190[0xf] = auVar1._30_2_;
    local_190 = local_190 + 0x10;
    pfStackY_260 = pfVar4;
  }
  return;
}

Assistant:

INTGEMM_AVX512BW static void Quantize(const float *input, int16_t *output, float quant_mult, Index size) {
    assert(size % 16 == 0);
    assert(reinterpret_cast<uintptr_t>(input) % 64 == 0);
    // Fill with the quantization multiplier.
    const __m512 quant_mult_reg = _mm512_set1_ps(quant_mult);
    const float *end = input + size;
    for (; input != end; input += 16, output += 16) {
      // There doesn't seem to be an unmasked version.
      _mm512_mask_cvtsepi32_storeu_epi16(output, 0xffff, QuantizerGrab(input, quant_mult_reg));
    }
  }